

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdge * __thiscall
ON_SubDimple::AddEdge
          (ON_SubDimple *this,uint candidate_edge_id,ON_SubDEdgeTag edge_tag,ON_SubDVertex *v0,
          double v0_sector_coefficient,ON_SubDVertex *v1,double v1_sector_coefficient,
          uint initial_face_capacity)

{
  ushort uVar1;
  ON_SubDLevel *pOVar2;
  ON_SubDVertex *v;
  bool bVar3;
  uint uVar4;
  ON_SubDEdge *e;
  ON_SubDEdge *pOVar5;
  ON_SubDHeap *this_00;
  ulong uVar6;
  double dVar7;
  double local_48;
  
  bVar3 = ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient,true);
  if (((!bVar3) ||
      (bVar3 = ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient,true), !bVar3)
      ) || ((v1 != (ON_SubDVertex *)0x0 && v0 != (ON_SubDVertex *)0x0 &&
            ((v0->super_ON_SubDComponentBase).m_level != (v1->super_ON_SubDComponentBase).m_level)))
     ) goto LAB_005e14b5;
  local_48 = v0_sector_coefficient;
  if ((((edge_tag < (SmoothX|Smooth)) && ((0x16U >> (edge_tag & 0x1f) & 1) != 0)) &&
      ((v0_sector_coefficient != 0.0 || (NAN(v0_sector_coefficient))))) &&
     ((v0 != (ON_SubDVertex *)0x0 &&
      (((v0_sector_coefficient != -8883.0 || (NAN(v0_sector_coefficient))) &&
       (v0->m_vertex_tag == Smooth)))))) {
    local_48 = 0.0;
  }
  if ((edge_tag < (SmoothX|Smooth)) && ((0x16U >> (edge_tag & 0x1f) & 1) != 0)) {
    if (((v1_sector_coefficient != 0.0) || (NAN(v1_sector_coefficient))) &&
       ((v1 != (ON_SubDVertex *)0x0 &&
        (((v1_sector_coefficient != -8883.0 || (NAN(v1_sector_coefficient))) &&
         (v1->m_vertex_tag == Smooth)))))) {
      v1_sector_coefficient = 0.0;
    }
  }
  this_00 = &this->m_heap;
  e = ON_SubDHeap::AllocateEdgeAndSetId(this_00,candidate_edge_id);
  e->m_edge_tag = edge_tag;
  (e->super_ON_SubDComponentBase).m_level = '\0';
  if (e == (ON_SubDEdge *)0x0) goto LAB_005e14b5;
  if (v0 == (ON_SubDVertex *)0x0) {
    if (v1 != (ON_SubDVertex *)0x0) {
      uVar4 = (uint)(v1->super_ON_SubDComponentBase).m_level;
      goto LAB_005e1402;
    }
    pOVar2 = this->m_active_level;
    uVar4 = 0;
    if (pOVar2 == (ON_SubDLevel *)0x0) {
LAB_005e14f2:
      if (uVar4 < 0x100) goto LAB_005e1402;
    }
    else if (pOVar2->m_level_index != 0xffffffff) {
      uVar4 = 0;
      if (pOVar2 != (ON_SubDLevel *)0x0) {
        uVar4 = pOVar2->m_level_index;
      }
      goto LAB_005e14f2;
    }
  }
  else {
    uVar4 = (uint)(v0->super_ON_SubDComponentBase).m_level;
LAB_005e1402:
    (e->super_ON_SubDComponentBase).m_level = (uchar)uVar4;
  }
  uVar6 = 0;
  do {
    dVar7 = local_48;
    v = v0;
    if (uVar6 != 0) {
      dVar7 = v1_sector_coefficient;
      v = v1;
    }
    e->m_vertex[uVar6] = v;
    e->m_sector_coefficient[uVar6] = dVar7;
    if (v != (ON_SubDVertex *)0x0) {
      bVar3 = ON_SubDHeap::GrowVertexEdgeArrayByOne(this_00,v);
      if (!bVar3) {
        ON_ComponentStatus::SetDamagedState(&(v->super_ON_SubDComponentBase).m_status,true);
        ReturnEdge(this,e);
        goto LAB_005e14b5;
      }
      uVar1 = v->m_edge_count;
      v->m_edge_count = uVar1 + 1;
      v->m_edges[uVar1].m_ptr = uVar6 | (ulong)e;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 == 1);
  pOVar5 = AddEdgeToLevel(this,e);
  if (pOVar5 != (ON_SubDEdge *)0x0) {
    if (initial_face_capacity < 3) {
      return e;
    }
    ON_SubDHeap::GrowEdgeFaceArray(this_00,e,(ulong)initial_face_capacity);
    return e;
  }
LAB_005e14b5:
  ON_SubDIncrementErrorCount();
  return (ON_SubDEdge *)0x0;
}

Assistant:

class ON_SubDEdge* ON_SubDimple::AddEdge(
  unsigned int candidate_edge_id,
  ON_SubDEdgeTag edge_tag,
  ON_SubDVertex* v0,
  double v0_sector_coefficient,
  ON_SubDVertex* v1,
  double v1_sector_coefficient,
  unsigned initial_face_capacity
)
{
  if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (nullptr != v0 && nullptr != v1 && v0->SubdivisionLevel() != v1->SubdivisionLevel())
    return ON_SUBD_RETURN_ERROR(nullptr);

  const bool bEdgeTagSet = ON_SubD::EdgeTagIsSet(edge_tag);

  if (bEdgeTagSet
    && ON_SubDSectorType::IgnoredSectorCoefficient != v0_sector_coefficient
    && ON_SubDSectorType::UnsetSectorCoefficient != v0_sector_coefficient
    && nullptr != v0
    && ON_SubDVertexTag::Smooth == v0->m_vertex_tag
    )
  {
    // minimizes checking when building subds because constant crease coefficients can be passed in
    v0_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
  }

  if (bEdgeTagSet
    && ON_SubDSectorType::IgnoredSectorCoefficient != v1_sector_coefficient
    && ON_SubDSectorType::UnsetSectorCoefficient != v1_sector_coefficient
    && nullptr != v1
    && ON_SubDVertexTag::Smooth == v1->m_vertex_tag
    )
  {
    // minimizes checking when building subds because constant crease coefficients can be passed in
    v1_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
  }

  class ON_SubDEdge* e = AllocateEdge(candidate_edge_id, edge_tag, 0, 0);
  if (nullptr == e)
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (nullptr != v0)
    e->SetSubdivisionLevel(v0->SubdivisionLevel());
  else if (nullptr != v1)
    e->SetSubdivisionLevel(v1->SubdivisionLevel());
  else if (ActiveLevelIndex() < ON_UNSET_UINT_INDEX)
    e->SetSubdivisionLevel(ActiveLevelIndex());

  for (unsigned int i = 0; i < 2; i++)
  {
    ON_SubDVertex* v = (i ? v1 : v0);
    double vertex_coefficient = (i ? v1_sector_coefficient : v0_sector_coefficient);
    e->m_vertex[i] = v;
    e->m_sector_coefficient[i] = vertex_coefficient;
    if (nullptr != v)
    {
      if (false == m_heap.GrowVertexEdgeArrayByOne(v))
      {
        v->m_status.SetDamagedState(true);
        ReturnEdge(e);
        return ON_SUBD_RETURN_ERROR(nullptr);
      }
      v->m_edges[v->m_edge_count++] = ON_SubDEdgePtr::Create(e, i);
    }
  }

  if ( nullptr == AddEdgeToLevel(e) )
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (initial_face_capacity > 2)
  {
    m_heap.GrowEdgeFaceArray(e, initial_face_capacity);
  }

  return e;
}